

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

void __thiscall lr_grammar::GrammarLR::create_dfa_states(GrammarLR *this)

{
  pointer pEVar1;
  pointer pcVar2;
  pointer pDVar3;
  bool bVar4;
  pointer pPVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pointer pDVar11;
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *this_00;
  int index;
  long lVar12;
  ulong uVar14;
  ulong uVar15;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> projects;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> local_a8;
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *local_90;
  DFAState local_88;
  ulong local_60;
  long local_58;
  string local_50;
  ulong uVar13;
  
  local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_finish = (Project *)0x0;
  local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Project *)0x0;
  pEVar1 = (this->elements).
           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl
           .super__Vector_impl_data._M_start;
  pcVar2 = (pEVar1->super_Elem).name._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (pEVar1->super_Elem).name._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  local_88.projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = find_name(this,&local_50);
  local_88.projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_88.projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  if (local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl
      .super__Vector_impl_data._M_finish ==
      local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::
    _M_realloc_insert<lr_grammar::Project>
              (&local_a8,
               (iterator)
               local_a8.
               super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl
               .super__Vector_impl_data._M_finish,(Project *)&local_88);
  }
  else {
    (local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
     super__Vector_impl_data._M_finish)->projectPoint = 0;
    (local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
     super__Vector_impl_data._M_finish)->elemKey =
         (int)(ulong)(uint)local_88.projects.
                           super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    (local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
     super__Vector_impl_data._M_finish)->expressIndex =
         (int)((ulong)(uint)local_88.projects.
                            super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  closure(this,&local_a8);
  DFAState::DFAState(&local_88,&local_a8,0,
                     (int)((ulong)((long)(this->elements).
                                         super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->elements).
                                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39);
  this_00 = &this->states;
  std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
  emplace_back<lr_grammar::DFAState>(this_00,&local_88);
  DFAState::~DFAState(&local_88);
  if ((this->states).super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->states).super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    local_90 = this_00;
    do {
      pDVar11 = (this_00->
                super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar5 = *(pointer *)
                &pDVar11[uVar8].projects.
                 super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                 _M_impl;
      local_60 = uVar8;
      if (*(pointer *)
           ((long)&pDVar11[uVar8].projects.
                   super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                   _M_impl + 8) != pPVar5) {
        uVar15 = 0;
        do {
          lVar10 = (long)pPVar5[uVar15].expressIndex;
          lVar12 = *(long *)&(this->elements).
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             ._M_impl.super__Vector_impl_data._M_start[pPVar5[uVar15].elemKey].
                             expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar12 + 8 + lVar10 * 0x18) - *(long *)(lVar12 + lVar10 * 0x18) >> 2 !=
              (long)pPVar5[uVar15].projectPoint) {
            piVar6 = base_grammar::Express::operator[]
                               ((Express *)(lVar12 + lVar10 * 0x18),pPVar5[uVar15].projectPoint);
            lVar12 = (long)*piVar6;
            pDVar11 = (this_00->
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (pDVar11[uVar8].next[lVar12] == -1) {
              smove(this,pDVar11 + uVar8,*piVar6,&local_a8);
              closure(this,&local_a8);
              pDVar11 = (this->states).
                        super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar3 = (this->states).
                       super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar13 = ((long)pDVar3 - (long)pDVar11 >> 3) * -0x3333333333333333;
              index = (int)uVar13;
              local_58 = lVar12;
              if (pDVar3 != pDVar11) {
                lVar12 = 0;
                uVar9 = 0;
                do {
                  bVar4 = DFAState::operator==
                                    ((DFAState *)
                                     ((long)&(pDVar11->projects).
                                             super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar12),
                                     &local_a8);
                  uVar14 = uVar9;
                  if (bVar4) break;
                  uVar9 = uVar9 + 1;
                  pDVar11 = (this->states).
                            super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar7 = ((long)(this->states).
                                 super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar11 >> 3) *
                          -0x3333333333333333;
                  lVar12 = lVar12 + 0x28;
                  uVar14 = uVar13;
                } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
                index = (int)uVar14;
                this_00 = local_90;
              }
              if (((long)(this->states).
                         super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->states).
                         super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
                  (long)index == 0) {
                DFAState::DFAState(&local_88,&local_a8,index,
                                   (int)((ulong)((long)(this->elements).
                                                                                                              
                                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->elements).
                                                                                                            
                                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                   0x38e38e39);
                std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                emplace_back<lr_grammar::DFAState>(this_00,&local_88);
                DFAState::~DFAState(&local_88);
              }
              (this_00->
              super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar8].next[local_58] = index;
            }
          }
          uVar15 = uVar15 + 1;
          pDVar11 = (this_00->
                    super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar5 = *(pointer *)
                    &pDVar11[uVar8].projects.
                     super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                     _M_impl;
          uVar13 = ((long)*(pointer *)
                           ((long)&pDVar11[uVar8].projects.
                                   super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                   ._M_impl + 8) - (long)pPVar5 >> 2) * -0x5555555555555555;
        } while (uVar15 <= uVar13 && uVar13 - uVar15 != 0);
      }
      uVar8 = local_60 + 1;
      uVar15 = ((long)(this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar8 <= uVar15 && uVar15 - uVar8 != 0);
  }
  if (local_a8.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GrammarLR::create_dfa_states(){


    //开始计算,项目的点的下标是下一个
    //项目A->.abb 点的位置为0
    vector<Project> projects;
    projects.push_back(Project(find_name(elements[0].name + "'"), 0, 0));
    closure(projects);

    this->states.push_back(DFAState(projects, 0, elements.size()));


    //开始计算
    //S0是0下标，持续增长的
    for (int stateIndex = 0; stateIndex < this->states.size(); stateIndex++){

        //每一个状态的smove都要计算一下，针对是每一个项目集合，不用针对所有的元素
        for (int i = 0; i < states[stateIndex].projects.size(); i++){

            Project tmp = states[stateIndex].projects[i];

            //这是一个可移进后面没有smove了
            if (tmp.projectPoint == elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size()){
                continue;
            }
            //.后面的数的元素
            int elemIndex = elements[tmp.elemKey].expression_of_set[tmp.expressIndex][tmp.projectPoint];

            //先判断这个元素是不是已经计算了,不是-1已经计算了
            if (states[stateIndex].next[elemIndex] != -1) continue;

            //计算smove;
            smove(states[stateIndex], elemIndex, projects);

            //计算空闭包
            closure(projects);

            int countIndex = states.size();
            //看看这个状态是不是已经出现过了
            for (int i = 0; i < states.size(); i++){

                if (states[i] == projects){
                    countIndex = i;
                    break;
                }
            }

            //新状态，需要被push
            if (countIndex == states.size()){
                states.push_back(DFAState(projects, countIndex, elements.size()));
            }

            //给原来的状态进行调整
            states[stateIndex].next[elemIndex] = countIndex;

        }

    }


}